

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

TPZFMatrix<TFad<6,_double>_> * __thiscall
TPZTensor::operator_cast_to_TPZFMatrix
          (TPZFMatrix<TFad<6,_double>_> *__return_storage_ptr__,TPZTensor *this)

{
  long lVar1;
  TFad<6,_double> *pTVar2;
  TFad<6,_double> *pTVar3;
  
  TPZFMatrix<TFad<6,_double>_>::TPZFMatrix(__return_storage_ptr__,3,3);
  pTVar3 = *(TFad<6,_double> **)(this + 0x10);
  pTVar2 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,0,0);
  TFad<6,_double>::operator=(pTVar2,pTVar3);
  lVar1 = *(long *)(this + 0x10);
  pTVar3 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,1,0);
  pTVar3 = TFad<6,_double>::operator=(pTVar3,(TFad<6,_double> *)(lVar1 + 0x40));
  pTVar2 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,0,1);
  TFad<6,_double>::operator=(pTVar2,pTVar3);
  lVar1 = *(long *)(this + 0x10);
  pTVar3 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,2,0);
  pTVar3 = TFad<6,_double>::operator=(pTVar3,(TFad<6,_double> *)(lVar1 + 0x80));
  pTVar2 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,0,2);
  TFad<6,_double>::operator=(pTVar2,pTVar3);
  lVar1 = *(long *)(this + 0x10);
  pTVar3 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,1,1);
  TFad<6,_double>::operator=(pTVar3,(TFad<6,_double> *)(lVar1 + 0xc0));
  lVar1 = *(long *)(this + 0x10);
  pTVar3 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,2,1);
  pTVar3 = TFad<6,_double>::operator=(pTVar3,(TFad<6,_double> *)(lVar1 + 0x100));
  pTVar2 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,1,2);
  TFad<6,_double>::operator=(pTVar2,pTVar3);
  lVar1 = *(long *)(this + 0x10);
  pTVar3 = TPZFMatrix<TFad<6,_double>_>::operator()(__return_storage_ptr__,2,2);
  TFad<6,_double>::operator=(pTVar3,(TFad<6,_double> *)(lVar1 + 0x140));
  return __return_storage_ptr__;
}

Assistant:

operator TPZFMatrix<T>() const {
        TPZFMatrix<T> result(3, 3);
        result(0, 0) = XX();
        result(0, 1) = result(1, 0) = XY();
        result(0, 2) = result(2, 0) = XZ();
        result(1, 1) = YY();
        result(1, 2) = result(2, 1) = YZ();
        result(2, 2) = ZZ();
        return result;
    }